

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O3

void ConnCloseHandler(CManager cm,CMConnection conn,void *client_data)

{
  key_type *__k;
  AnonADIOSFile *this;
  mapped_type pAVar1;
  _Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false> _Var2;
  mapped_type *ppAVar3;
  ostream *poVar4;
  mapped_type *ppAVar5;
  _Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false> __tmp;
  pair<std::__detail::_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false>,_std::__detail::_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false>_>
  pVar6;
  undefined1 local_58 [32];
  CMConnection local_38;
  
  local_58._0_8_ = conn;
  local_38 = conn;
  pVar6 = std::
          _Hashtable<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
          ::equal_range(&ConnToFileMap._M_h,(key_type *)local_58);
  for (_Var2._M_cur = (__node_type *)
                      pVar6.first.
                      super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>._M_cur
      ; (_Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>)_Var2._M_cur !=
        pVar6.second.super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>._M_cur.
        super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>;
      _Var2._M_cur = (__node_type *)((_Var2._M_cur)->super__Hash_node_base)._M_nxt) {
    __k = (key_type *)
          (((_Var2._M_cur)->super__Hash_node_value<std::pair<void_*const,_unsigned_long>,_false>).
           super__Hash_node_value_base<std::pair<void_*const,_unsigned_long>_>._M_storage._M_storage
           .__data + 8);
    ppAVar3 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonADIOSFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonADIOSFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&ADIOSFileMap,__k);
    this = *ppAVar3;
    if (this != (AnonADIOSFile *)0x0) {
      if (0 < verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"closing ADIOS file \"",0x14);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(this->m_FileName)._M_dataplus._M_p,
                            (this->m_FileName)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" total sent ",0xd);
        readable_size_abi_cxx11_((string *)local_58,this->m_BytesSent);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_58._0_8_,local_58._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," in ",4);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," Get()s",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if ((CMConnection)local_58._0_8_ != (CMConnection)(local_58 + 0x10)) {
          operator_delete((void *)local_58._0_8_);
        }
      }
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_AnonADIOSFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&ADIOSFileMap._M_h,__k);
      AnonADIOSFile::~AnonADIOSFile(this);
      operator_delete(this);
    }
    ppAVar5 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonSimpleFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonSimpleFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonSimpleFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonSimpleFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&SimpleFileMap,__k);
    pAVar1 = *ppAVar5;
    if (pAVar1 != (mapped_type)0x0) {
      if (0 < verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"closing simple file ",0x14);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(pAVar1->m_FileName)._M_dataplus._M_p,
                            (pAVar1->m_FileName)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" total sent ",0xd);
        readable_size_abi_cxx11_((string *)local_58,pAVar1->m_BytesSent);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_58._0_8_,local_58._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," in ",4);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," Read()s",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if ((CMConnection)local_58._0_8_ != (CMConnection)(local_58 + 0x10)) {
          operator_delete((void *)local_58._0_8_);
        }
      }
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_AnonSimpleFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonSimpleFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&SimpleFileMap._M_h,__k);
      if (this != (AnonADIOSFile *)0x0) {
        AnonADIOSFile::~AnonADIOSFile(this);
      }
      operator_delete(this);
    }
  }
  local_58._0_8_ = local_38;
  std::
  _Hashtable<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::_M_erase(&ConnToFileMap._M_h);
  return;
}

Assistant:

static void ConnCloseHandler(CManager cm, CMConnection conn, void *client_data)
{
    auto it = ConnToFileMap.equal_range(conn);
    for (auto it1 = it.first; it1 != it.second; it1++)
    {
        AnonADIOSFile *file = ADIOSFileMap[it1->second];
        if (file)
        {
            if (verbose >= 1)
                std::cout << "closing ADIOS file \"" << file->m_FileName << "\" total sent "
                          << readable_size(file->m_BytesSent) << " in " << file->m_OperationCount
                          << " Get()s" << std::endl;
            ADIOSFileMap.erase(it1->second);
            delete file;
        }
        AnonSimpleFile *sfile = SimpleFileMap[it1->second];
        if (sfile)
        {
            if (verbose >= 1)
                std::cout << "closing simple file " << sfile->m_FileName << "\" total sent "
                          << readable_size(sfile->m_BytesSent) << " in " << sfile->m_OperationCount
                          << " Read()s" << std::endl;
            SimpleFileMap.erase(it1->second);
            delete file;
        }
    }
    ConnToFileMap.erase(conn);
}